

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::solveUleftNoNZ
          (CLUFactor<double> *this,double eps,double *vec,double *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double *pdVar10;
  reference pvVar11;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  double in_RDI;
  int in_R8D;
  int m;
  double *val;
  double *rval;
  int *idx;
  int *rbeg;
  int *rlen;
  int *ridx;
  int *cperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int k;
  int j;
  int i;
  double y;
  double x;
  double in_stack_ffffffffffffff48;
  int local_a4;
  double *local_a0;
  int *local_90;
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  
  lVar3 = *(long *)((long)in_RDI + 0x38);
  lVar4 = *(long *)((long)in_RDI + 0x48);
  lVar5 = *(long *)((long)in_RDI + 0x50);
  local_44 = 0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while (local_44 < local_2c) {
    enQueueMin(local_28,&local_44,*(int *)(lVar5 + (long)local_28[local_44] * 4));
  }
  lVar6 = *(long *)((long)in_RDI + 0x138);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x299b93);
  lVar7 = *(long *)((long)in_RDI + 0x148);
  lVar8 = *(long *)((long)in_RDI + 0x140);
  while (0 < local_2c) {
    local_44 = deQueueMin(local_28,&local_2c);
    iVar1 = *(int *)(lVar4 + (long)local_44 * 4);
    local_38 = *(double *)(local_20 + (long)iVar1 * 8);
    *(undefined8 *)(local_20 + (long)iVar1 * 8) = 0;
    bVar9 = isNotZero<double,double>(in_RDI,in_stack_ffffffffffffff48);
    if (bVar9) {
      iVar1 = *(int *)(lVar3 + (long)local_44 * 4);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xe0),
                           (long)iVar1);
      local_38 = *pvVar11 * local_38;
      *(double *)(local_18 + (long)iVar1 * 8) = local_38;
      iVar2 = *(int *)(lVar8 + (long)iVar1 * 4);
      local_a0 = pdVar10 + iVar2;
      local_90 = (int *)(lVar6 + (long)iVar2 * 4);
      for (local_a4 = *(int *)(lVar7 + (long)iVar1 * 4); local_a4 != 0; local_a4 = local_a4 + -1) {
        iVar1 = *local_90;
        local_40 = *(double *)(local_20 + (long)iVar1 * 8);
        if ((local_40 != 0.0) || (NAN(local_40))) {
          local_40 = local_40 - local_38 * *local_a0;
          in_stack_ffffffffffffff48 = local_40;
          if ((local_40 == 0.0) && (!NAN(local_40))) {
            in_stack_ffffffffffffff48 = 1e-100;
          }
          *(double *)(local_20 + (long)iVar1 * 8) = in_stack_ffffffffffffff48;
        }
        else {
          local_40 = -local_38 * *local_a0;
          bVar9 = isNotZero<double,double>(in_RDI,in_stack_ffffffffffffff48);
          if (bVar9) {
            *(double *)(local_20 + (long)iVar1 * 8) = local_40;
            enQueueMin(local_28,&local_2c,*(int *)(lVar5 + (long)iVar1 * 4));
          }
        }
        local_a0 = local_a0 + 1;
        local_90 = local_90 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}